

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O2

void __thiscall HdlcAnalyzerSettings::LoadSettings(HdlcAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mInputChannel);
  SimpleArchive::operator>>(&text_archive,&this->mBitRate);
  SimpleArchive::operator>>(&text_archive,&this->mTransmissionMode);
  SimpleArchive::operator>>(&text_archive,&this->mHdlcAddr);
  SimpleArchive::operator>>(&text_archive,&this->mHdlcControl);
  SimpleArchive::operator>>(&text_archive,&this->mHdlcFcs);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void HdlcAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> *( U32* )&mTransmissionMode;
    text_archive >> *( U32* )&mHdlcAddr;
    text_archive >> *( U32* )&mHdlcControl;
    text_archive >> *( U32* )&mHdlcFcs;

    ClearChannels();
    AddChannel( mInputChannel, "HDLC", true );

    UpdateInterfacesFromSettings();
}